

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_write_compressed_img_plane
              (fitsfile *fptr,int datatype,int bytesperpixel,long nplane,long *firstcoord,
              long *lastcoord,long *naxes,int nullcheck,void *array,void *nullval,long *nread,
              int *status)

{
  long lVar1;
  void *local_a0;
  char *arrayptr;
  long trc [6];
  long blc [6];
  long *lastcoord_local;
  long *firstcoord_local;
  long nplane_local;
  int bytesperpixel_local;
  int datatype_local;
  fitsfile *fptr_local;
  
  *nread = 0;
  local_a0 = array;
  trc[1] = nplane + 1;
  if (*firstcoord != 0) {
    trc[5] = *firstcoord + 1;
    trc[0] = firstcoord[1] + 1;
    if (lastcoord[1] == firstcoord[1]) {
      arrayptr = (char *)(*lastcoord + 1);
    }
    else {
      arrayptr = (char *)*naxes;
    }
    fits_write_compressed_img
              (fptr,datatype,trc + 5,(long *)&arrayptr,nullcheck,array,nullval,status);
    *nread = (long)(arrayptr + (*nread - trc[5]) + 1);
    if (lastcoord[1] == firstcoord[1]) {
      return *status;
    }
    *firstcoord = 0;
    firstcoord[1] = firstcoord[1] + 1;
    local_a0 = (void *)((long)array + (long)(arrayptr + (1 - trc[5])) * (long)bytesperpixel);
  }
  trc[5] = 1;
  lVar1 = firstcoord[1] + 1;
  arrayptr = (char *)*naxes;
  if (*lastcoord + 1 == *naxes) {
    trc[0] = lastcoord[1] + 1;
  }
  else {
    trc[0] = lastcoord[1];
  }
  if (lVar1 <= trc[0]) {
    fits_write_compressed_img
              (fptr,datatype,trc + 5,(long *)&arrayptr,nullcheck,local_a0,nullval,status);
    *nread = *nread + ((trc[0] - lVar1) + 1) * *naxes;
    if (lastcoord[1] + 1 == trc[0]) {
      return *status;
    }
    local_a0 = (void *)((long)local_a0 + ((trc[0] - lVar1) + 1) * *naxes * (long)bytesperpixel);
  }
  if (trc[0] == lastcoord[1] + 1) {
    fptr_local._4_4_ = *status;
  }
  else {
    arrayptr = (char *)(*lastcoord + 1);
    trc[0] = lastcoord[1] + 1;
    fits_write_compressed_img
              (fptr,datatype,trc + 5,(long *)&arrayptr,nullcheck,local_a0,nullval,status);
    *nread = (long)(arrayptr + (*nread - trc[5]) + 1);
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_write_compressed_img_plane(fitsfile *fptr, /* I - FITS file    */
            int  datatype,  /* I - datatype of the array to be written    */
            int  bytesperpixel, /* I - number of bytes per pixel in array */
            long   nplane,  /* I - which plane of the cube to write      */
            long *firstcoord, /* I coordinate of first pixel to write */
            long *lastcoord,  /* I coordinate of last pixel to write */
            long *naxes,     /* I size of each image dimension */
            int  nullcheck,  /* I - 0 for no null checking                   */
                             /*     1: pixels that are = nullval will be     */
                             /*     written with the FITS null pixel value   */
                             /*     (floating point arrays only)             */
            void *array,      /* I - array of values that are written        */
            void *nullval,    /* I - value for undefined pixels              */
            long *nread,      /* O - total number of pixels written          */
            int  *status)     /* IO - error status                           */

   /*
           in general we have to write the first partial row of the image,
           followed by the middle complete rows, followed by the last
           partial row of the image.  If the first or last rows are complete,
           then write them at the same time as all the middle rows.
    */
{
    /* bottom left coord. and top right coord. */
    long blc[MAX_COMPRESS_DIM], trc[MAX_COMPRESS_DIM]; 
    char *arrayptr;

    *nread = 0;

    arrayptr = (char *) array;

    blc[2] = nplane + 1;
    trc[2] = nplane + 1;

    if (firstcoord[0] != 0)
    { 
            /* have to read a partial first row */
            blc[0] = firstcoord[0] + 1;
            blc[1] = firstcoord[1] + 1;
            trc[1] = blc[1];  
            if (lastcoord[1] == firstcoord[1])
               trc[0] = lastcoord[0] + 1; /* 1st and last pixels in same row */
            else
               trc[0] = naxes[0];  /* read entire rest of the row */

            fits_write_compressed_img(fptr, datatype, blc, trc,
                nullcheck, arrayptr, nullval, status);

            *nread = *nread + trc[0] - blc[0] + 1;

            if (lastcoord[1] == firstcoord[1])
            {
               return(*status);  /* finished */
            }

            /* set starting coord to beginning of next line */
            firstcoord[0] = 0;
            firstcoord[1] += 1;
            arrayptr = arrayptr + (trc[0] - blc[0] + 1) * bytesperpixel;
    }

    /* write contiguous complete rows of the image, if any */
    blc[0] = 1;
    blc[1] = firstcoord[1] + 1;
    trc[0] = naxes[0];

    if (lastcoord[0] + 1 == naxes[0])
    {
            /* can write the last complete row, too */
            trc[1] = lastcoord[1] + 1;
    }
    else
    {
            /* last row is incomplete; have to read it separately */
            trc[1] = lastcoord[1];
    }

    if (trc[1] >= blc[1])  /* must have at least one whole line to read */
    {
        fits_write_compressed_img(fptr, datatype, blc, trc,
                nullcheck, arrayptr, nullval, status);

        *nread = *nread + (trc[1] - blc[1] + 1) * naxes[0];

        if (lastcoord[1] + 1 == trc[1])
               return(*status);  /* finished */

        /* increment pointers for the last partial row */
        arrayptr = arrayptr + (trc[1] - blc[1] + 1) * naxes[0] * bytesperpixel;

     }

    if (trc[1] == lastcoord[1] + 1)
        return(*status);           /* all done */

    /* set starting and ending coord to last line */

    trc[0] = lastcoord[0] + 1;
    trc[1] = lastcoord[1] + 1;
    blc[1] = trc[1];

    fits_write_compressed_img(fptr, datatype, blc, trc,
                nullcheck, arrayptr, nullval, status);

    *nread = *nread + trc[0] - blc[0] + 1;

    return(*status);
}